

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictz.cpp
# Opt level: O0

void __thiscall
icu_63::BasicTimeZone::getTimeZoneRulesAfter
          (BasicTimeZone *this,UDate start,InitialTimeZoneRule **initial,UVector **transitionRules,
          UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  undefined8 uVar5;
  InitialTimeZoneRule **ppIVar6;
  UBool UVar7;
  char cVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  uint uVar12;
  uint uVar13;
  int32_t dstSavings;
  int32_t endYear;
  UVector *pUVar14;
  void *obj;
  TimeZoneRule *pTVar15;
  TimeZoneRule *pTVar16;
  undefined4 extraout_var;
  TimeArrayTimeZoneRule *this_00;
  undefined4 extraout_var_00;
  AnnualTimeZoneRule *this_01;
  DateTimeRule *dateTimeRule;
  long *plVar17;
  InitialTimeZoneRule *size;
  size_t size_00;
  UnicodeString *pUVar18;
  UDate UVar19;
  AnnualTimeZoneRule *local_410;
  TimeZoneRule *local_3b0;
  TimeArrayTimeZoneRule *local_388;
  TimeArrayTimeZoneRule *local_2e8;
  TimeZoneRule *local_268;
  UVector *local_248;
  UVector *local_1f8;
  AnnualTimeZoneRule *newAr;
  int32_t local_1c0;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  TimeArrayTimeZoneRule *local_1a0;
  TimeArrayTimeZoneRule *newTar;
  int local_190;
  int32_t newidx;
  int32_t asize;
  int32_t idx;
  TimeRuleType timeType;
  int32_t startTimes;
  TimeZoneTransition tzt0;
  AnnualTimeZoneRule *ar;
  TimeArrayTimeZoneRule *tar;
  TimeZoneRule *toRule;
  UDate updatedTime;
  UBool bFinalDst;
  double dStack_108;
  UBool bFinalStd;
  UDate firstStart;
  UDate *newTimes;
  UDate t;
  UDate time;
  int32_t i;
  undefined1 local_d8 [8];
  UnicodeString name;
  UVector *filteredRules;
  InitialTimeZoneRule *res_initial;
  UBool *done;
  TimeZoneRule *r;
  UVector *pUStack_70;
  int32_t ruleCount;
  UVector *orgRules;
  undefined1 local_60 [7];
  UBool avail;
  TimeZoneTransition tzt;
  TimeZoneRule **orgtrs;
  InitialTimeZoneRule *orgini;
  UErrorCode *status_local;
  UVector **transitionRules_local;
  InitialTimeZoneRule **initial_local;
  UDate start_local;
  BasicTimeZone *this_local;
  
  orgini = (InitialTimeZoneRule *)status;
  status_local = (UErrorCode *)transitionRules;
  transitionRules_local = (UVector **)initial;
  initial_local = (InitialTimeZoneRule **)start;
  start_local = (UDate)this;
  UVar7 = ::U_FAILURE(*status);
  if (UVar7 != '\0') {
    return;
  }
  tzt.fTo = (TimeZoneRule *)0x0;
  TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_60);
  pUStack_70 = (UVector *)0x0;
  res_initial = (InitialTimeZoneRule *)0x0;
  filteredRules = (UVector *)0x0;
  name.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_d8);
  firstStart = 0.0;
  bVar1 = false;
  bVar2 = false;
  size = orgini;
  r._4_4_ = (*(this->super_TimeZone).super_UObject._vptr_UObject[0x11])();
  UVar7 = ::U_FAILURE(*(UErrorCode *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject);
  if (UVar7 == '\0') {
    pUVar14 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    local_1f8 = (UVector *)0x0;
    if (pUVar14 != (UVector *)0x0) {
      UVector::UVector(pUVar14,r._4_4_,(UErrorCode *)orgini);
      local_1f8 = pUVar14;
    }
    pUStack_70 = local_1f8;
    UVar7 = ::U_FAILURE(*(UErrorCode *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject);
    if (UVar7 == '\0') {
      tzt.fTo = (TimeZoneRule *)uprv_malloc_63((long)r._4_4_ << 3);
      if (tzt.fTo == (TimeZoneRule *)0x0) {
        *(undefined4 *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject = 7;
      }
      else {
        (*(this->super_TimeZone).super_UObject._vptr_UObject[0x12])
                  (this,&orgtrs,tzt.fTo,(long)&r + 4,orgini);
        UVar7 = ::U_FAILURE(*(UErrorCode *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject
                           );
        if (UVar7 == '\0') {
          for (time._0_4_ = 0; pUVar14 = pUStack_70, time._0_4_ < r._4_4_;
              time._0_4_ = time._0_4_ + 1) {
            obj = (void *)(**(code **)(*(&(tzt.fTo)->super_UObject)[time._0_4_]._vptr_UObject + 0x18
                                      ))();
            UVector::addElement(pUVar14,obj,(UErrorCode *)orgini);
            UVar7 = ::U_FAILURE(*(UErrorCode *)
                                 &(orgini->super_TimeZoneRule).super_UObject._vptr_UObject);
            if (UVar7 != '\0') goto LAB_0020561c;
          }
          uprv_free_63(tzt.fTo);
          tzt.fTo = (TimeZoneRule *)0x0;
          size_00 = 1;
          iVar9 = (*(this->super_TimeZone).super_UObject._vptr_UObject[0xf])
                            (initial_local,this,1,local_60);
          orgRules._7_1_ = (char)iVar9;
          if (orgRules._7_1_ == '\0') {
            pUVar14 = (UVector *)(**(code **)((long)&((*orgtrs)->fName).fUnion + 8))();
            *transitionRules_local = pUVar14;
            *(UVector **)status_local = pUStack_70;
            goto LAB_002057b5;
          }
          res_initial = (InitialTimeZoneRule *)uprv_malloc_63((long)r._4_4_);
          if (res_initial == (InitialTimeZoneRule *)0x0) {
            *(undefined4 *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject = 7;
          }
          else {
            pUVar14 = (UVector *)UMemory::operator_new((UMemory *)0x28,size_00);
            local_248 = (UVector *)0x0;
            if (pUVar14 != (UVector *)0x0) {
              UVector::UVector(pUVar14,(UErrorCode *)orgini);
              local_248 = pUVar14;
            }
            name.fUnion._48_8_ = local_248;
            UVar7 = ::U_FAILURE(*(UErrorCode *)
                                 &(orgini->super_TimeZoneRule).super_UObject._vptr_UObject);
            if (UVar7 == '\0') {
              pTVar15 = TimeZoneTransition::getTo((TimeZoneTransition *)local_60);
              pUVar18 = (UnicodeString *)local_d8;
              TimeZoneRule::getName(pTVar15,pUVar18);
              pTVar15 = (TimeZoneRule *)UMemory::operator_new((UMemory *)0x50,(size_t)pUVar18);
              local_268 = (TimeZoneRule *)0x0;
              if (pTVar15 != (TimeZoneRule *)0x0) {
                pTVar16 = TimeZoneTransition::getTo((TimeZoneTransition *)local_60);
                iVar10 = TimeZoneRule::getRawOffset(pTVar16);
                pTVar16 = TimeZoneTransition::getTo((TimeZoneTransition *)local_60);
                iVar11 = TimeZoneRule::getDSTSavings(pTVar16);
                InitialTimeZoneRule::InitialTimeZoneRule
                          ((InitialTimeZoneRule *)pTVar15,(UnicodeString *)local_d8,iVar10,iVar11);
                local_268 = pTVar15;
              }
              filteredRules = (UVector *)local_268;
              for (time._0_4_ = 0; time._0_4_ < r._4_4_; time._0_4_ = time._0_4_ + 1) {
                plVar17 = (long *)UVector::elementAt(pUStack_70,time._0_4_);
                ppIVar6 = initial_local;
                iVar10 = TimeZoneRule::getRawOffset(local_268);
                iVar11 = TimeZoneRule::getDSTSavings(local_268);
                orgRules._7_1_ = (**(code **)(*plVar17 + 0x48))(ppIVar6,plVar17,iVar10,iVar11,0,&t);
                *(byte *)((long)&(res_initial->super_TimeZoneRule).super_UObject._vptr_UObject +
                         (long)time._0_4_) = (orgRules._7_1_ != '\0' ^ 0xffU) & 1;
              }
              t = (UDate)initial_local;
              while (!bVar1 || !bVar2) {
                iVar9 = (*(this->super_TimeZone).super_UObject._vptr_UObject[0xe])
                                  (t,this,0,local_60);
                orgRules._7_1_ = (char)iVar9;
                if (orgRules._7_1_ == '\0') break;
                UVar19 = TimeZoneTransition::getTime((TimeZoneTransition *)local_60);
                if ((UVar19 == t) && (!NAN(UVar19) && !NAN(t))) {
                  *(undefined4 *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject = 0x1b;
                  goto LAB_0020561c;
                }
                t = UVar19;
                pTVar15 = TimeZoneTransition::getTo((TimeZoneTransition *)local_60);
                for (time._0_4_ = 0; time._0_4_ < r._4_4_; time._0_4_ = time._0_4_ + 1) {
                  plVar17 = (long *)UVector::elementAt(pUStack_70,time._0_4_);
                  cVar8 = (**(code **)(*plVar17 + 0x20))();
                  if (cVar8 != '\0') break;
                }
                if (r._4_4_ <= time._0_4_) {
                  *(undefined4 *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject = 0x1b;
                  goto LAB_0020561c;
                }
                if (*(char *)((long)&(res_initial->super_TimeZoneRule).super_UObject._vptr_UObject +
                             (long)time._0_4_) == '\0') {
                  if (pTVar15 == (TimeZoneRule *)0x0) {
                    local_2e8 = (TimeArrayTimeZoneRule *)0x0;
                  }
                  else {
                    local_2e8 = (TimeArrayTimeZoneRule *)
                                __dynamic_cast(pTVar15,&TimeZoneRule::typeinfo,
                                               &TimeArrayTimeZoneRule::typeinfo,0);
                  }
                  if (local_2e8 == (TimeArrayTimeZoneRule *)0x0) {
                    if (pTVar15 == (TimeZoneRule *)0x0) {
                      local_3b0 = (TimeZoneRule *)0x0;
                    }
                    else {
                      local_3b0 = (TimeZoneRule *)
                                  __dynamic_cast(pTVar15,&TimeZoneRule::typeinfo,
                                                 &AnnualTimeZoneRule::typeinfo,0);
                    }
                    tzt0.fTo = local_3b0;
                    if (local_3b0 != (TimeZoneRule *)0x0) {
                      pTVar15 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_60);
                      uVar12 = TimeZoneRule::getRawOffset(pTVar15);
                      pTVar15 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_60);
                      uVar13 = TimeZoneRule::getDSTSavings(pTVar15);
                      (*(local_3b0->super_UObject)._vptr_UObject[7])
                                (local_3b0,(ulong)uVar12,(ulong)uVar13,&stack0xfffffffffffffef8);
                      dVar4 = dStack_108;
                      UVar19 = TimeZoneTransition::getTime((TimeZoneTransition *)local_60);
                      uVar5 = name.fUnion._48_8_;
                      if ((dVar4 != UVar19) || (NAN(dVar4) || NAN(UVar19))) {
                        UVar19 = TimeZoneTransition::getTime((TimeZoneTransition *)local_60);
                        Grego::timeToFields(UVar19,&dom,&dow,&doy,&mid,&local_1c0,
                                            (int32_t *)((long)&newAr + 4));
                        pUVar18 = (UnicodeString *)local_d8;
                        TimeZoneRule::getName(tzt0.fTo,pUVar18);
                        this_01 = (AnnualTimeZoneRule *)
                                  UMemory::operator_new((UMemory *)0x60,(size_t)pUVar18);
                        local_410 = (AnnualTimeZoneRule *)0x0;
                        if (this_01 != (AnnualTimeZoneRule *)0x0) {
                          iVar11 = TimeZoneRule::getRawOffset(tzt0.fTo);
                          dstSavings = TimeZoneRule::getDSTSavings(tzt0.fTo);
                          dateTimeRule = AnnualTimeZoneRule::getRule((AnnualTimeZoneRule *)tzt0.fTo)
                          ;
                          iVar10 = dom;
                          endYear = AnnualTimeZoneRule::getEndYear((AnnualTimeZoneRule *)tzt0.fTo);
                          AnnualTimeZoneRule::AnnualTimeZoneRule
                                    (this_01,(UnicodeString *)local_d8,iVar11,dstSavings,
                                     dateTimeRule,iVar10,endYear);
                          local_410 = this_01;
                        }
                        UVector::addElement((UVector *)name.fUnion._48_8_,local_410,
                                            (UErrorCode *)orgini);
                        cVar8 = ::U_FAILURE(*(UErrorCode *)
                                             &(orgini->super_TimeZoneRule).super_UObject.
                                              _vptr_UObject);
                      }
                      else {
                        iVar9 = (*((tzt0.fTo)->super_UObject)._vptr_UObject[3])();
                        UVector::addElement((UVector *)uVar5,(void *)CONCAT44(extraout_var_00,iVar9)
                                            ,(UErrorCode *)orgini);
                        cVar8 = ::U_FAILURE(*(UErrorCode *)
                                             &(orgini->super_TimeZoneRule).super_UObject.
                                              _vptr_UObject);
                      }
                      if (cVar8 != '\0') goto LAB_0020561c;
                      iVar10 = AnnualTimeZoneRule::getEndYear((AnnualTimeZoneRule *)tzt0.fTo);
                      if (iVar10 == 0x7fffffff) {
                        iVar10 = TimeZoneRule::getDSTSavings(tzt0.fTo);
                        if (iVar10 == 0) {
                          bVar1 = true;
                        }
                        else {
                          bVar2 = true;
                        }
                      }
                    }
                  }
                  else {
                    TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)&timeType);
                    newTimes = (UDate *)initial_local;
                    while( true ) {
                      iVar9 = (*(this->super_TimeZone).super_UObject._vptr_UObject[0xe])
                                        (newTimes,this,0,&timeType);
                      orgRules._7_1_ = (char)iVar9;
                      if (orgRules._7_1_ == '\0') break;
                      pTVar15 = TimeZoneTransition::getTo((TimeZoneTransition *)&timeType);
                      iVar9 = (*(pTVar15->super_UObject)._vptr_UObject[4])();
                      if ((char)iVar9 != '\0') break;
                      newTimes = (UDate *)TimeZoneTransition::getTime
                                                    ((TimeZoneTransition *)&timeType);
                    }
                    if (orgRules._7_1_ == '\0') {
LAB_0020514a:
                      bVar3 = false;
                    }
                    else {
                      pTVar15 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_60);
                      uVar12 = TimeZoneRule::getRawOffset(pTVar15);
                      pTVar15 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_60);
                      uVar13 = TimeZoneRule::getDSTSavings(pTVar15);
                      (*(local_2e8->super_TimeZoneRule).super_UObject._vptr_UObject[7])
                                (local_2e8,(ulong)uVar12,(ulong)uVar13,&stack0xfffffffffffffef8);
                      uVar5 = name.fUnion._48_8_;
                      if ((double)initial_local < dStack_108) {
                        iVar9 = (*(local_2e8->super_TimeZoneRule).super_UObject._vptr_UObject[3])();
                        UVector::addElement((UVector *)uVar5,(void *)CONCAT44(extraout_var,iVar9),
                                            (UErrorCode *)orgini);
                        UVar7 = ::U_FAILURE(*(UErrorCode *)
                                             &(orgini->super_TimeZoneRule).super_UObject.
                                              _vptr_UObject);
                        if (UVar7 != '\0') {
                          bVar3 = true;
                          goto LAB_00205154;
                        }
                        goto LAB_0020514a;
                      }
                      idx = TimeArrayTimeZoneRule::countStartTimes(local_2e8);
                      asize = TimeArrayTimeZoneRule::getTimeType(local_2e8);
                      for (newidx = 0; newidx < idx; newidx = newidx + 1) {
                        TimeArrayTimeZoneRule::getStartTimeAt(local_2e8,newidx,(UDate *)&newTimes);
                        if (asize == 1) {
                          pTVar15 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_60);
                          iVar10 = TimeZoneRule::getRawOffset(pTVar15);
                          newTimes = (UDate *)((double)newTimes - (double)iVar10);
                        }
                        if (asize == 0) {
                          pTVar15 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_60);
                          iVar10 = TimeZoneRule::getDSTSavings(pTVar15);
                          newTimes = (UDate *)((double)newTimes - (double)iVar10);
                        }
                        if ((double)initial_local < (double)newTimes) break;
                      }
                      local_190 = idx - newidx;
                      if (local_190 < 1) goto LAB_0020514a;
                      firstStart = (UDate)uprv_malloc_63((long)local_190 << 3);
                      if ((void *)firstStart == (void *)0x0) {
                        *(undefined4 *)&(orgini->super_TimeZoneRule).super_UObject._vptr_UObject = 7
                        ;
                        bVar3 = true;
                      }
                      else {
                        for (newTar._4_4_ = 0; newTar._4_4_ < local_190;
                            newTar._4_4_ = newTar._4_4_ + 1) {
                          TimeArrayTimeZoneRule::getStartTimeAt
                                    (local_2e8,newidx + newTar._4_4_,
                                     (UDate *)((long)firstStart + (long)newTar._4_4_ * 8));
                          UVar7 = ::U_FAILURE(*(UErrorCode *)
                                               &(orgini->super_TimeZoneRule).super_UObject.
                                                _vptr_UObject);
                          if (UVar7 != '\0') {
                            uprv_free_63((void *)firstStart);
                            firstStart = 0.0;
                            bVar3 = true;
                            goto LAB_00205154;
                          }
                        }
                        pUVar18 = (UnicodeString *)local_d8;
                        TimeZoneRule::getName(&local_2e8->super_TimeZoneRule,pUVar18);
                        this_00 = (TimeArrayTimeZoneRule *)
                                  UMemory::operator_new((UMemory *)0x160,(size_t)pUVar18);
                        month._3_1_ = 0;
                        local_388 = (TimeArrayTimeZoneRule *)0x0;
                        if (this_00 != (TimeArrayTimeZoneRule *)0x0) {
                          month._3_1_ = 1;
                          _year = this_00;
                          iVar10 = TimeZoneRule::getRawOffset(&local_2e8->super_TimeZoneRule);
                          iVar11 = TimeZoneRule::getDSTSavings(&local_2e8->super_TimeZoneRule);
                          TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                                    (this_00,(UnicodeString *)local_d8,iVar10,iVar11,
                                     (UDate *)firstStart,local_190,asize);
                          local_388 = this_00;
                        }
                        local_1a0 = local_388;
                        uprv_free_63((void *)firstStart);
                        UVector::addElement((UVector *)name.fUnion._48_8_,local_1a0,
                                            (UErrorCode *)orgini);
                        UVar7 = ::U_FAILURE(*(UErrorCode *)
                                             &(orgini->super_TimeZoneRule).super_UObject.
                                              _vptr_UObject);
                        if (UVar7 == '\0') goto LAB_0020514a;
                        bVar3 = true;
                      }
                    }
LAB_00205154:
                    TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)&timeType);
                    if (bVar3) {
                      if (bVar3) goto LAB_0020561c;
                      goto LAB_002057b5;
                    }
                  }
                  *(undefined1 *)
                   ((long)&(res_initial->super_TimeZoneRule).super_UObject._vptr_UObject +
                   (long)time._0_4_) = 1;
                }
              }
              if (pUStack_70 != (UVector *)0x0) {
                while (UVar7 = UVector::isEmpty(pUStack_70), UVar7 == '\0') {
                  plVar17 = (long *)UVector::orphanElementAt(pUStack_70,0);
                  if (plVar17 != (long *)0x0) {
                    (**(code **)(*plVar17 + 8))();
                  }
                }
                if (pUStack_70 != (UVector *)0x0) {
                  (*(pUStack_70->super_UObject)._vptr_UObject[1])();
                }
              }
              if (res_initial != (InitialTimeZoneRule *)0x0) {
                uprv_free_63(res_initial);
              }
              *transitionRules_local = (UVector *)local_268;
              *(undefined8 *)status_local = name.fUnion._48_8_;
              goto LAB_002057b5;
            }
          }
        }
      }
LAB_0020561c:
      if (tzt.fTo != (TimeZoneRule *)0x0) {
        uprv_free_63(tzt.fTo);
      }
      if (pUStack_70 != (UVector *)0x0) {
        while (UVar7 = UVector::isEmpty(pUStack_70), UVar7 == '\0') {
          plVar17 = (long *)UVector::orphanElementAt(pUStack_70,0);
          if (plVar17 != (long *)0x0) {
            (**(code **)(*plVar17 + 8))();
          }
        }
        if (pUStack_70 != (UVector *)0x0) {
          (*(pUStack_70->super_UObject)._vptr_UObject[1])();
        }
      }
      if (res_initial != (InitialTimeZoneRule *)0x0) {
        if (name.fUnion._48_8_ != 0) {
          while (UVar7 = UVector::isEmpty((UVector *)name.fUnion._48_8_), UVar7 == '\0') {
            plVar17 = (long *)UVector::orphanElementAt((UVector *)name.fUnion._48_8_,0);
            if (plVar17 != (long *)0x0) {
              (**(code **)(*plVar17 + 8))();
            }
          }
          if (name.fUnion._48_8_ != 0) {
            (**(code **)(*(long *)name.fUnion._48_8_ + 8))();
          }
        }
        if (filteredRules != (UVector *)0x0) {
          (*(filteredRules->super_UObject)._vptr_UObject[1])();
        }
        uprv_free_63(res_initial);
      }
      *transitionRules_local = (UVector *)0x0;
      status_local[0] = U_ZERO_ERROR;
      status_local[1] = U_ZERO_ERROR;
    }
  }
LAB_002057b5:
  UnicodeString::~UnicodeString((UnicodeString *)local_d8);
  TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_60);
  return;
}

Assistant:

void
BasicTimeZone::getTimeZoneRulesAfter(UDate start, InitialTimeZoneRule*& initial,
                                     UVector*& transitionRules, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }

    const InitialTimeZoneRule *orgini;
    const TimeZoneRule **orgtrs = NULL;
    TimeZoneTransition tzt;
    UBool avail;
    UVector *orgRules = NULL;
    int32_t ruleCount;
    TimeZoneRule *r = NULL;
    UBool *done = NULL;
    InitialTimeZoneRule *res_initial = NULL;
    UVector *filteredRules = NULL;
    UnicodeString name;
    int32_t i;
    UDate time, t;
    UDate *newTimes = NULL;
    UDate firstStart;
    UBool bFinalStd = FALSE, bFinalDst = FALSE;

    // Original transition rules
    ruleCount = countTransitionRules(status);
    if (U_FAILURE(status)) {
        return;
    }
    orgRules = new UVector(ruleCount, status);
    if (U_FAILURE(status)) {
        return;
    }
    orgtrs = (const TimeZoneRule**)uprv_malloc(sizeof(TimeZoneRule*)*ruleCount);
    if (orgtrs == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto error;
    }
    getTimeZoneRules(orgini, orgtrs, ruleCount, status);
    if (U_FAILURE(status)) {
        goto error;
    }
    for (i = 0; i < ruleCount; i++) {
        orgRules->addElement(orgtrs[i]->clone(), status);
        if (U_FAILURE(status)) {
            goto error;
        }
    }
    uprv_free(orgtrs);
    orgtrs = NULL;

    avail = getPreviousTransition(start, TRUE, tzt);
    if (!avail) {
        // No need to filter out rules only applicable to time before the start
        initial = orgini->clone();
        transitionRules = orgRules;
        return;
    }

    done = (UBool*)uprv_malloc(sizeof(UBool)*ruleCount);
    if (done == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto error;
    }
    filteredRules = new UVector(status);
    if (U_FAILURE(status)) {
        goto error;
    }

    // Create initial rule
    tzt.getTo()->getName(name);
    res_initial = new InitialTimeZoneRule(name, tzt.getTo()->getRawOffset(),
        tzt.getTo()->getDSTSavings());

    // Mark rules which does not need to be processed
    for (i = 0; i < ruleCount; i++) {
        r = (TimeZoneRule*)orgRules->elementAt(i);
        avail = r->getNextStart(start, res_initial->getRawOffset(), res_initial->getDSTSavings(), FALSE, time);
        done[i] = !avail;
    }

    time = start;
    while (!bFinalStd || !bFinalDst) {
        avail = getNextTransition(time, FALSE, tzt);
        if (!avail) {
            break;
        }
        UDate updatedTime = tzt.getTime();
        if (updatedTime == time) {
            // Can get here if rules for start & end of daylight time have exactly
            // the same time.  
            // TODO:  fix getNextTransition() to prevent it?
            status = U_INVALID_STATE_ERROR;
            goto error;
        }
        time = updatedTime;
 
        const TimeZoneRule *toRule = tzt.getTo();
        for (i = 0; i < ruleCount; i++) {
            r = (TimeZoneRule*)orgRules->elementAt(i);
            if (*r == *toRule) {
                break;
            }
        }
        if (i >= ruleCount) {
            // This case should never happen
            status = U_INVALID_STATE_ERROR;
            goto error;
        }
        if (done[i]) {
            continue;
        }
        const TimeArrayTimeZoneRule *tar = dynamic_cast<const TimeArrayTimeZoneRule *>(toRule);
        const AnnualTimeZoneRule *ar;
        if (tar != NULL) {
            // Get the previous raw offset and DST savings before the very first start time
            TimeZoneTransition tzt0;
            t = start;
            while (TRUE) {
                avail = getNextTransition(t, FALSE, tzt0);
                if (!avail) {
                    break;
                }
                if (*(tzt0.getTo()) == *tar) {
                    break;
                }
                t = tzt0.getTime();
            }
            if (avail) {
                // Check if the entire start times to be added
                tar->getFirstStart(tzt.getFrom()->getRawOffset(), tzt.getFrom()->getDSTSavings(), firstStart);
                if (firstStart > start) {
                    // Just add the rule as is
                    filteredRules->addElement(tar->clone(), status);
                    if (U_FAILURE(status)) {
                        goto error;
                    }
                } else {
                    // Colllect transitions after the start time
                    int32_t startTimes;
                    DateTimeRule::TimeRuleType timeType;
                    int32_t idx;

                    startTimes = tar->countStartTimes();
                    timeType = tar->getTimeType();
                    for (idx = 0; idx < startTimes; idx++) {
                        tar->getStartTimeAt(idx, t);
                        if (timeType == DateTimeRule::STANDARD_TIME) {
                            t -= tzt.getFrom()->getRawOffset();
                        }
                        if (timeType == DateTimeRule::WALL_TIME) {
                            t -= tzt.getFrom()->getDSTSavings();
                        }
                        if (t > start) {
                            break;
                        }
                    }
                    int32_t asize = startTimes - idx;
                    if (asize > 0) {
                        newTimes = (UDate*)uprv_malloc(sizeof(UDate) * asize);
                        if (newTimes == NULL) {
                            status = U_MEMORY_ALLOCATION_ERROR;
                            goto error;
                        }
                        for (int32_t newidx = 0; newidx < asize; newidx++) {
                            tar->getStartTimeAt(idx + newidx, newTimes[newidx]);
                            if (U_FAILURE(status)) {
                                uprv_free(newTimes);
                                newTimes = NULL;
                                goto error;
                            }
                        }
                        tar->getName(name);
                        TimeArrayTimeZoneRule *newTar = new TimeArrayTimeZoneRule(name,
                            tar->getRawOffset(), tar->getDSTSavings(), newTimes, asize, timeType);
                        uprv_free(newTimes);
                        filteredRules->addElement(newTar, status);
                        if (U_FAILURE(status)) {
                            goto error;
                        }
                    }
                }
            }
        } else if ((ar = dynamic_cast<const AnnualTimeZoneRule *>(toRule)) != NULL) {
            ar->getFirstStart(tzt.getFrom()->getRawOffset(), tzt.getFrom()->getDSTSavings(), firstStart);
            if (firstStart == tzt.getTime()) {
                // Just add the rule as is
                filteredRules->addElement(ar->clone(), status);
                if (U_FAILURE(status)) {
                    goto error;
                }
            } else {
                // Calculate the transition year
                int32_t year, month, dom, dow, doy, mid;
                Grego::timeToFields(tzt.getTime(), year, month, dom, dow, doy, mid);
                // Re-create the rule
                ar->getName(name);
                AnnualTimeZoneRule *newAr = new AnnualTimeZoneRule(name, ar->getRawOffset(), ar->getDSTSavings(),
                    *(ar->getRule()), year, ar->getEndYear());
                filteredRules->addElement(newAr, status);
                if (U_FAILURE(status)) {
                    goto error;
                }
            }
            // check if this is a final rule
            if (ar->getEndYear() == AnnualTimeZoneRule::MAX_YEAR) {
                // After bot final standard and dst rules are processed,
                // exit this while loop.
                if (ar->getDSTSavings() == 0) {
                    bFinalStd = TRUE;
                } else {
                    bFinalDst = TRUE;
                }
            }
        }
        done[i] = TRUE;
    }

    // Set the results
    if (orgRules != NULL) {
        while (!orgRules->isEmpty()) {
            r = (TimeZoneRule*)orgRules->orphanElementAt(0);
            delete r;
        }
        delete orgRules;
    }
    if (done != NULL) {
        uprv_free(done);
    }

    initial = res_initial;
    transitionRules = filteredRules;
    return;

error:
    if (orgtrs != NULL) {
        uprv_free(orgtrs);
    }
    if (orgRules != NULL) {
        while (!orgRules->isEmpty()) {
            r = (TimeZoneRule*)orgRules->orphanElementAt(0);
            delete r;
        }
        delete orgRules;
    }
    if (done != NULL) {
        if (filteredRules != NULL) {
            while (!filteredRules->isEmpty()) {
                r = (TimeZoneRule*)filteredRules->orphanElementAt(0);
                delete r;
            }
            delete filteredRules;
        }
        delete res_initial;
        uprv_free(done);
    }

    initial = NULL;
    transitionRules = NULL;
}